

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAlloc(sqlite3 *db,int op,Token *pToken,int dequote)

{
  int iVar1;
  Expr *pEVar2;
  ulong uVar3;
  int iVar4;
  Expr *z;
  long in_FS_OFFSET;
  int iValue;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_34 = 0;
  iVar4 = 0;
  if (pToken != (Token *)0x0) {
    if ((op == 0x9c) && (pToken->z != (char *)0x0)) {
      iVar1 = sqlite3GetInt32(pToken->z,&local_34);
      iVar4 = 0;
      if (iVar1 != 0) goto LAB_0016ed63;
    }
    iVar4 = pToken->n + 1;
  }
LAB_0016ed63:
  pEVar2 = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar4 + 0x48);
  if (pEVar2 != (Expr *)0x0) {
    pEVar2->op = '\0';
    pEVar2->affExpr = '\0';
    pEVar2->op2 = '\0';
    pEVar2->field_0x3 = 0;
    pEVar2->flags = 0;
    (pEVar2->u).zToken = (char *)0x0;
    pEVar2->iColumn = 0;
    pEVar2->iAgg = 0;
    pEVar2->w = (anon_union_4_2_009eaf8f_for_w)0x0;
    pEVar2->pAggInfo = (AggInfo *)0x0;
    (pEVar2->x).pList = (ExprList *)0x0;
    pEVar2->nHeight = 0;
    pEVar2->iTable = 0;
    pEVar2->pLeft = (Expr *)0x0;
    pEVar2->pRight = (Expr *)0x0;
    (pEVar2->y).pTab = (Table *)0x0;
    pEVar2->op = (u8)op;
    pEVar2->iAgg = -1;
    if (pToken != (Token *)0x0) {
      if (iVar4 == 0) {
        pEVar2->flags = pEVar2->flags | (uint)(local_34 == 0) * 0x10000000 + 0x10800800;
        (pEVar2->u).iValue = local_34;
      }
      else {
        z = pEVar2 + 1;
        (pEVar2->u).zToken = (char *)z;
        if ((ulong)pToken->n == 0) {
          uVar3 = 0;
        }
        else {
          memcpy(z,pToken->z,(ulong)pToken->n);
          uVar3 = (ulong)pToken->n;
        }
        (&z->op)[uVar3] = '\0';
        if ((dequote != 0) && ((char)""[z->op] < '\0')) {
          pEVar2->flags = (uint)(z->op == 0x22) << 7 | pEVar2->flags | 0x4000000;
          sqlite3Dequote((char *)z);
        }
      }
    }
    pEVar2->nHeight = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pEVar2;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAlloc(
  sqlite3 *db,            /* Handle for sqlite3DbMallocRawNN() */
  int op,                 /* Expression opcode */
  const Token *pToken,    /* Token argument.  Might be NULL */
  int dequote             /* True to dequote */
){
  Expr *pNew;
  int nExtra = 0;
  int iValue = 0;

  assert( db!=0 );
  if( pToken ){
    if( op!=TK_INTEGER || pToken->z==0
          || sqlite3GetInt32(pToken->z, &iValue)==0 ){
      nExtra = pToken->n+1;  /* tag-20240227-a */
      assert( iValue>=0 );
    }
  }
  pNew = sqlite3DbMallocRawNN(db, sizeof(Expr)+nExtra);
  if( pNew ){
    memset(pNew, 0, sizeof(Expr));
    pNew->op = (u8)op;
    pNew->iAgg = -1;
    if( pToken ){
      if( nExtra==0 ){
        pNew->flags |= EP_IntValue|EP_Leaf|(iValue?EP_IsTrue:EP_IsFalse);
        pNew->u.iValue = iValue;
      }else{
        pNew->u.zToken = (char*)&pNew[1];
        assert( pToken->z!=0 || pToken->n==0 );
        if( pToken->n ) memcpy(pNew->u.zToken, pToken->z, pToken->n);
        pNew->u.zToken[pToken->n] = 0;
        if( dequote && sqlite3Isquote(pNew->u.zToken[0]) ){
          sqlite3DequoteExpr(pNew);
        }
      }
    }
#if SQLITE_MAX_EXPR_DEPTH>0
    pNew->nHeight = 1;
#endif
  }
  return pNew;
}